

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_custom_aggregator.cpp
# Opt level: O3

void __thiscall
duckdb::WindowCustomAggregatorState::WindowCustomAggregatorState
          (WindowCustomAggregatorState *this,AggregateObject *aggr,WindowExcludeMode exclude_mode)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  FunctionNullHandling FVar7;
  FunctionErrors FVar8;
  FunctionCollationHandling FVar9;
  AggregateDistinctDependent AVar10;
  idx_t iVar11;
  PhysicalType PVar12;
  undefined2 uVar13;
  Allocator *allocator;
  idx_t iVar14;
  pointer pFVar15;
  long lVar16;
  aggregate_size_t *pp_Var17;
  aggregate_size_t *pp_Var18;
  byte bVar19;
  Value local_70;
  
  bVar19 = 0;
  (this->super_WindowAggregatorLocalState).super_WindowAggregatorState._vptr_WindowAggregatorState =
       (_func_int **)&PTR__WindowAggregatorState_02446ae0;
  allocator = Allocator::DefaultAllocator();
  ArenaAllocator::ArenaAllocator
            (&(this->super_WindowAggregatorLocalState).super_WindowAggregatorState.allocator,
             allocator,0x800);
  (this->super_WindowAggregatorLocalState).cursor.
  super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
  super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>.
  super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl = (WindowCursor *)0x0;
  (this->super_WindowAggregatorLocalState).super_WindowAggregatorState._vptr_WindowAggregatorState =
       (_func_int **)&PTR__WindowCustomAggregatorState_02445ff0;
  SimpleFunction::SimpleFunction((SimpleFunction *)&this->aggr,(SimpleFunction *)aggr);
  (this->aggr).function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function
       = (_func_int **)&PTR__BaseScalarFunction_02446ee0;
  LogicalType::LogicalType
            (&(this->aggr).function.super_BaseScalarFunction.return_type,
             &(aggr->function).super_BaseScalarFunction.return_type);
  FVar7 = (aggr->function).super_BaseScalarFunction.null_handling;
  FVar8 = (aggr->function).super_BaseScalarFunction.errors;
  FVar9 = (aggr->function).super_BaseScalarFunction.collation_handling;
  (this->aggr).function.super_BaseScalarFunction.stability =
       (aggr->function).super_BaseScalarFunction.stability;
  (this->aggr).function.super_BaseScalarFunction.null_handling = FVar7;
  (this->aggr).function.super_BaseScalarFunction.errors = FVar8;
  (this->aggr).function.super_BaseScalarFunction.collation_handling = FVar9;
  (this->aggr).function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function
       = (_func_int **)&PTR__AggregateFunction_0243ae10;
  pp_Var17 = &(aggr->function).state_size;
  pp_Var18 = &(this->aggr).function.state_size;
  for (lVar16 = 0xd; lVar16 != 0; lVar16 = lVar16 + -1) {
    *pp_Var18 = *pp_Var17;
    pp_Var17 = pp_Var17 + (ulong)bVar19 * -2 + 1;
    pp_Var18 = pp_Var18 + (ulong)bVar19 * -2 + 1;
  }
  AVar10 = (aggr->function).distinct_dependent;
  (this->aggr).function.order_dependent = (aggr->function).order_dependent;
  (this->aggr).function.distinct_dependent = AVar10;
  (this->aggr).function.function_info.internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (aggr->function).function_info.internal.
       super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (aggr->function).function_info.internal.
           super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  (this->aggr).function.function_info.internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->aggr).bind_data_wrapper.internal.
  super___shared_ptr<duckdb::FunctionDataWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (aggr->bind_data_wrapper).internal.
       super___shared_ptr<duckdb::FunctionDataWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (aggr->bind_data_wrapper).internal.
           super___shared_ptr<duckdb::FunctionDataWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->aggr).bind_data_wrapper.internal.
  super___shared_ptr<duckdb::FunctionDataWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  iVar14 = aggr->child_count;
  uVar2 = *(undefined4 *)((long)&aggr->child_count + 4);
  iVar11 = aggr->payload_size;
  uVar3 = *(undefined4 *)((long)&aggr->payload_size + 4);
  PVar12 = aggr->return_type;
  uVar13 = *(undefined2 *)&aggr->field_0x152;
  uVar4 = *(undefined4 *)&aggr->field_0x154;
  uVar5 = *(undefined4 *)&aggr->filter;
  uVar6 = *(undefined4 *)((long)&aggr->filter + 4);
  (this->aggr).aggr_type = aggr->aggr_type;
  (this->aggr).return_type = PVar12;
  *(undefined2 *)&(this->aggr).field_0x152 = uVar13;
  *(undefined4 *)&(this->aggr).field_0x154 = uVar4;
  *(undefined4 *)&(this->aggr).filter = uVar5;
  *(undefined4 *)((long)&(this->aggr).filter + 4) = uVar6;
  *(int *)&(this->aggr).child_count = (int)iVar14;
  *(undefined4 *)((long)&(this->aggr).child_count + 4) = uVar2;
  *(int *)&(this->aggr).payload_size = (int)iVar11;
  *(undefined4 *)((long)&(this->aggr).payload_size + 4) = uVar3;
  iVar14 = (*(aggr->function).state_size)(&aggr->function);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(this->state).super_vector<unsigned_char,_std::allocator<unsigned_char>_>,iVar14,
             (allocator_type *)&local_70);
  Value::POINTER(&local_70,
                 (uintptr_t)
                 (this->state).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start);
  Vector::Vector(&this->statef,&local_70);
  Value::~Value(&local_70);
  (this->frames).super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
  super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->frames).super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
  super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->frames).super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
  super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pFVar15 = (pointer)operator_new(0x30);
  (this->frames).super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
  super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
  super__Vector_impl_data._M_start = pFVar15;
  (this->frames).super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
  super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pFVar15 + 3;
  pFVar15[2].start = 0;
  pFVar15[2].end = 0;
  pFVar15[1].start = 0;
  pFVar15[1].end = 0;
  pFVar15->start = 0;
  pFVar15->end = 0;
  (this->frames).super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
  super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
  super__Vector_impl_data._M_finish = pFVar15 + 3;
  (*(aggr->function).initialize)
            (&aggr->function,
             (this->state).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  WindowAggregatorLocalState::InitSubFrames(&this->frames,exclude_mode);
  return;
}

Assistant:

WindowCustomAggregatorState::WindowCustomAggregatorState(const AggregateObject &aggr,
                                                         const WindowExcludeMode exclude_mode)
    : aggr(aggr), state(aggr.function.state_size(aggr.function)),
      statef(Value::POINTER(CastPointerToValue(state.data()))), frames(3, {0, 0}) {
	// if we have a frame-by-frame method, share the single state
	aggr.function.initialize(aggr.function, state.data());

	InitSubFrames(frames, exclude_mode);
}